

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall
leveldb::DBTest_GetPicksCorrectFile_Test::~DBTest_GetPicksCorrectFile_Test
          (DBTest_GetPicksCorrectFile_Test *this)

{
  DBTest::~DBTest(&this->super_DBTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(DBTest, GetPicksCorrectFile) {
  do {
    // Arrange to have multiple files in a non-level-0 level.
    ASSERT_LEVELDB_OK(Put("a", "va"));
    Compact("a", "b");
    ASSERT_LEVELDB_OK(Put("x", "vx"));
    Compact("x", "y");
    ASSERT_LEVELDB_OK(Put("f", "vf"));
    Compact("f", "g");
    ASSERT_EQ("va", Get("a"));
    ASSERT_EQ("vf", Get("f"));
    ASSERT_EQ("vx", Get("x"));
  } while (ChangeOptions());
}